

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O2

int skynet_context_push(uint32_t handle,skynet_message *message)

{
  int iVar1;
  skynet_context *ctx;
  
  ctx = skynet_handle_grab(handle);
  if (ctx == (skynet_context *)0x0) {
    iVar1 = -1;
  }
  else {
    skynet_mq_push(ctx->queue,message);
    skynet_context_release(ctx);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
skynet_context_push(uint32_t handle, struct skynet_message *message) {
	struct skynet_context * ctx = skynet_handle_grab(handle);
	if (ctx == NULL) {
		return -1;
	}
	skynet_mq_push(ctx->queue, message);
	skynet_context_release(ctx);

	return 0;
}